

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

void __thiscall
GenericAssemblerFile::GenericAssemblerFile
          (GenericAssemblerFile *this,path *fileName,path *originalFileName,int64_t headerSize)

{
  (this->super_AssemblerFile)._vptr_AssemblerFile =
       (_func_int **)&PTR__GenericAssemblerFile_001b4628;
  this->originalHeaderSize = headerSize;
  this->headerSize = headerSize;
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream(&this->stream);
  ghc::filesystem::path::path(&this->fileName,fileName);
  ghc::filesystem::path::path(&this->originalName,originalFileName);
  (*(this->super_AssemblerFile)._vptr_AssemblerFile[10])(this,0);
  this->mode = Copy;
  return;
}

Assistant:

GenericAssemblerFile::GenericAssemblerFile(const fs::path& fileName, const fs::path& originalFileName, int64_t headerSize)
	: originalHeaderSize(headerSize), headerSize(headerSize), fileName(fileName), originalName(originalFileName)
{
	this->seekPhysical(0);
	mode = Copy;
}